

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

void inform_decode(int32_t encoding,int b,int *state,size_t n,inform_error *err)

{
  ulong uVar1;
  ulong uVar2;
  inform_error iVar3;
  
  if (encoding < 0) {
LAB_0015e593:
    iVar3 = INFORM_EARG;
  }
  else {
    if (1 < b) {
      uVar2 = (ulong)(uint)encoding;
      if (n != 0 && state != (int *)0x0) {
        do {
          uVar1 = uVar2;
          state[n - 1] = (int)(uVar1 % (ulong)(uint)b);
          n = n - 1;
          uVar2 = uVar1 / (uint)b;
        } while (n != 0);
        iVar3 = INFORM_EENCODE;
        if (err == (inform_error *)0x0 || (uint)uVar1 < (uint)b) {
          return;
        }
        goto LAB_0015e59d;
      }
      goto LAB_0015e593;
    }
    iVar3 = INFORM_EBASE;
  }
  if (err == (inform_error *)0x0) {
    return;
  }
LAB_0015e59d:
  *err = iVar3;
  return;
}

Assistant:

void inform_decode(int32_t encoding, int b, int *state, size_t n, inform_error *err)
{
    if (encoding < 0)
        INFORM_ERROR_RETURN_VOID(err, INFORM_EARG);
    else if (b < 2)
        INFORM_ERROR_RETURN_VOID(err, INFORM_EBASE);
    else if (state == NULL || n == 0)
        INFORM_ERROR_RETURN_VOID(err, INFORM_EARG);

    for (size_t i = 0; i < n; ++i, encoding /= b)
        state[n - i - 1] = encoding % b;

    if (encoding != 0)
        INFORM_ERROR_RETURN_VOID(err, INFORM_EENCODE);
}